

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O3

void lj_dispatch_init(GG_State *GG)

{
  ushort uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 in_XMM0 [16];
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 in_XMM1 [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  lVar4 = 0;
  do {
    uVar1 = *(ushort *)((long)lj_bc_ofs + lVar4);
    *(code **)((long)GG->dispatch + lVar4 * 4) = lj_BC_ISLT + uVar1;
    *(code **)((long)GG->dispatch + lVar4 * 4 + 0x4d0) = lj_BC_ISLT + uVar1;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0xb2);
  lVar4 = 0;
  do {
    GG->dispatch[lVar4 + 0x59] = lj_BC_ISLT + lj_bc_ofs[lVar4 + 0x59];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x41);
  GG->dispatch[0x4f] = GG->dispatch[0x50];
  GG->dispatch[0x52] = GG->dispatch[0x53];
  GG->dispatch[0x46] = lj_vm_IITERN;
  GG->dispatch[0x55] = GG->dispatch[0x56];
  GG->dispatch[0x59] = GG->dispatch[0x5a];
  GG->dispatch[0x5c] = GG->dispatch[0x5d];
  (GG->g).bc_cfunc_int = 0x145f;
  auVar3 = _DAT_00162620;
  (GG->g).bc_cfunc_ext = 0x145f;
  auVar5 = pmovsxbq(in_XMM0,0x302);
  auVar7 = pmovsxbq(in_XMM1,0x100);
  lVar4 = 0;
  auVar8 = pmovsxbq(in_XMM4,0x404);
  do {
    auVar9 = auVar7 ^ auVar3;
    iVar2 = (int)lVar4;
    if (auVar9._0_8_ < -0x7fffffffffffffc7) {
      GG->bcff[lVar4] = iVar2 + 0x61;
    }
    if (auVar9._8_8_ < -0x7fffffffffffffc7) {
      GG->bcff[lVar4 + 1] = iVar2 + 0x62;
    }
    auVar9 = auVar5 ^ auVar3;
    if (auVar9._0_8_ < -0x7fffffffffffffc7) {
      GG->bcff[lVar4 + 2] = iVar2 + 99;
    }
    if (auVar9._8_8_ < -0x7fffffffffffffc7) {
      GG->bcff[lVar4 + 3] = iVar2 + 100;
    }
    lVar4 = lVar4 + 4;
    lVar6 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + auVar8._0_8_;
    auVar7._8_8_ = lVar6 + auVar8._8_8_;
    lVar6 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + auVar8._0_8_;
    auVar5._8_8_ = lVar6 + auVar8._8_8_;
  } while (lVar4 != 0x3c);
  return;
}

Assistant:

void lj_dispatch_init(GG_State *GG)
{
  uint32_t i;
  ASMFunction *disp = GG->dispatch;
  for (i = 0; i < GG_LEN_SDISP; i++)
    disp[GG_LEN_DDISP+i] = disp[i] = makeasmfunc(lj_bc_ofs[i]);
  for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
    disp[i] = makeasmfunc(lj_bc_ofs[i]);
  /* The JIT engine is off by default. luaopen_jit() turns it on. */
  disp[BC_FORL] = disp[BC_IFORL];
  disp[BC_ITERL] = disp[BC_IITERL];
  /* Workaround for stable v2.1 bytecode. TODO: Replace with BC_IITERN. */
  disp[BC_ITERN] = &lj_vm_IITERN;
  disp[BC_LOOP] = disp[BC_ILOOP];
  disp[BC_FUNCF] = disp[BC_IFUNCF];
  disp[BC_FUNCV] = disp[BC_IFUNCV];
  GG->g.bc_cfunc_ext = GG->g.bc_cfunc_int = BCINS_AD(BC_FUNCC, LUA_MINSTACK, 0);
  for (i = 0; i < GG_NUM_ASMFF; i++)
    GG->bcff[i] = BCINS_AD(BC__MAX+i, 0, 0);
#if LJ_TARGET_MIPS
  memcpy(GG->got, dispatch_got, LJ_GOT__MAX*sizeof(ASMFunction *));
#endif
}